

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_TextureCopy_24_to_32(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  byte *pbVar7;
  u32 dx_1;
  u8 *s_1;
  u32 dy_1;
  u8 *s;
  u32 dx;
  u32 src_y;
  u32 dy;
  float hscale;
  float wscale;
  u32 *dst;
  u8 *src;
  u32 h;
  u32 w;
  SBlitJob *job_local;
  
  uVar3 = job->width;
  uVar4 = job->height;
  src = (u8 *)job->src;
  dst = (u32 *)job->dst;
  if ((job->stretch & 1U) == 0) {
    for (dy_1 = 0; dy_1 < job->height; dy_1 = dy_1 + 1) {
      s_1 = src;
      for (dx_1 = 0; dx_1 < job->width; dx_1 = dx_1 + 1) {
        dst[dx_1] = (uint)*s_1 << 0x10 | 0xff000000 | (uint)s_1[1] << 8 | (uint)s_1[2];
        s_1 = s_1 + 3;
      }
      src = src + job->srcPitch;
      dst = (u32 *)((long)dst + (ulong)job->dstPitch);
    }
  }
  else {
    fVar1 = (float)job->x_stretch;
    fVar2 = (float)job->y_stretch;
    for (dy = 0; dy < uVar4; dy = dy + 1) {
      pvVar6 = job->src;
      iVar5 = job->srcPitch;
      for (dx = 0; dx < uVar3; dx = dx + 1) {
        pbVar7 = (byte *)((long)pvVar6 +
                         ((long)((float)dx * fVar1 * 3.0) & 0xffffffffU) +
                         (ulong)(uint)(iVar5 * (int)(long)((float)dy * fVar2)));
        dst[dx] = (uint)*pbVar7 << 0x10 | 0xff000000 | (uint)pbVar7[1] << 8 | (uint)pbVar7[2];
      }
      dst = (u32 *)((long)dst + (ulong)job->dstPitch);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_24_to_32(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u8 *src = static_cast<const u8 *>(job->src);
	u32 *dst = static_cast<u32 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch * 3.f;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (const u8 *)job->src + (job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u8 *s = src + (u32)(dx * wscale);
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
			}
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	} else {
		for (u32 dy = 0; dy < job->height; ++dy) {
			const u8 *s = src;

			for (u32 dx = 0; dx < job->width; ++dx) {
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
				s += 3;
			}

			src = src + job->srcPitch;
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	}
}